

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

GenerateBlockSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::GenerateBlockSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,unsigned_int&,bool>
          (BumpAllocator *this,Compilation *args,
          basic_string_view<char,_std::char_traits<char>_> *args_1,SourceLocation *args_2,
          uint *args_3,bool *args_4)

{
  string_view name;
  GenerateBlockSymbol *this_00;
  bool *args_local_4;
  uint *args_local_3;
  SourceLocation *args_local_2;
  basic_string_view<char,_std::char_traits<char>_> *args_local_1;
  Compilation *args_local;
  BumpAllocator *this_local;
  
  this_00 = (GenerateBlockSymbol *)allocate(this,0x80,8);
  name._M_len = args_1->_M_len;
  name._M_str = args_1->_M_str;
  ast::GenerateBlockSymbol::GenerateBlockSymbol
            (this_00,args,name,*args_2,*args_3,(bool)(*args_4 & 1));
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }